

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O1

void ym2612_update_chan<2>::func(tables_t *g,channel_t *ch,sample_t_conflict1 *buf,int length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  int local_e4;
  int local_e0;
  int local_d4;
  int local_d0;
  int local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_80;
  uint local_7c;
  int local_64;
  
  if (ch->SLOT[3].Ecnt != 0x20000000) {
    iVar1 = g->LFOinc;
    iVar11 = ch->SLOT[3].Fcnt;
    iVar12 = ch->SLOT[1].Fcnt;
    uVar19 = ch->SLOT[2].Fcnt;
    iVar20 = ch->SLOT[0].Fcnt;
    local_cc = ch->SLOT[0].Ecnt;
    iVar17 = ch->SLOT[2].Ecnt;
    local_d0 = ch->SLOT[1].Ecnt;
    local_d4 = ch->SLOT[3].Ecnt;
    local_90 = ch->SLOT[0].Ecmp;
    local_8c = ch->SLOT[0].Einc;
    uVar15 = g->LFOcnt;
    local_a0 = ch->SLOT[1].Ecmp;
    local_94 = ch->SLOT[1].Einc;
    local_a4 = ch->SLOT[2].Ecmp;
    local_98 = ch->SLOT[2].Einc;
    local_a8 = ch->SLOT[3].Ecmp;
    local_9c = ch->SLOT[3].Einc;
    local_bc = ch->SLOT[0].env_xor;
    local_ac = ch->SLOT[0].env_max;
    local_c0 = ch->SLOT[2].env_xor;
    local_b0 = ch->SLOT[2].env_max;
    local_c4 = ch->SLOT[1].env_xor;
    local_b4 = ch->SLOT[1].env_max;
    local_c8 = ch->SLOT[3].env_xor;
    local_b8 = ch->SLOT[3].env_max;
    local_80 = ch->SLOT[0].Ecurp;
    uVar21 = ch->SLOT[0].SEG;
    local_e0 = ch->SLOT[1].Ecurp;
    uVar7 = ch->SLOT[1].SEG;
    iVar9 = ch->SLOT[2].Ecurp;
    uVar22 = ch->SLOT[2].SEG;
    local_e4 = ch->SLOT[3].Ecurp;
    local_7c = ch->SLOT[3].SEG;
    lVar6 = 0;
    iVar8 = ch->S0_OUT[0];
    iVar2 = ch->S0_OUT[1];
    do {
      local_64 = iVar8;
      uVar15 = uVar15 + iVar1;
      uVar16 = (ulong)(uVar15 >> 0x11 & 0x7fe);
      iVar8 = (int)*(short *)((long)g->LFO_ENV_TAB + uVar16);
      uVar18 = (int)g->ENV_TAB[local_cc >> 0x10] + ch->SLOT[0].TLL;
      iVar13 = (iVar8 >> ((byte)ch->SLOT[0].AMS & 0x1f)) + (uVar18 ^ local_bc);
      if (local_ac <= (int)uVar18) {
        iVar13 = 0;
      }
      uVar18 = (int)g->ENV_TAB[iVar17 >> 0x10] + ch->SLOT[2].TLL;
      iVar3 = (iVar8 >> ((byte)ch->SLOT[2].AMS & 0x1f)) + (uVar18 ^ local_c0);
      if (local_b0 <= (int)uVar18) {
        iVar3 = 0;
      }
      uVar18 = (int)g->ENV_TAB[local_d0 >> 0x10] + ch->SLOT[1].TLL;
      iVar4 = (iVar8 >> ((byte)ch->SLOT[1].AMS & 0x1f)) + (uVar18 ^ local_c4);
      if (local_b4 <= (int)uVar18) {
        iVar4 = 0;
      }
      uVar18 = (int)g->ENV_TAB[local_d4 >> 0x10] + ch->SLOT[3].TLL;
      iVar10 = (iVar8 >> ((byte)ch->SLOT[3].AMS & 0x1f)) + (uVar18 ^ local_c8);
      if (local_b8 <= (int)uVar18) {
        iVar10 = 0;
      }
      iVar8 = g->TL_TAB[(long)iVar13 +
                        (long)*(short *)((long)g->SIN_TAB +
                                        (ulong)((uint)((iVar2 + local_64 >> ((byte)ch->FB & 0x1f)) +
                                                      iVar20) >> 0xd & 0x1ffe))];
      iVar14 = (int)*(short *)((long)g->TL_TAB +
                              ((long)iVar10 +
                              (long)*(short *)((long)g->SIN_TAB +
                                              (ulong)((uint)(local_64 + iVar11 +
                                                            g->TL_TAB[(long)iVar4 +
                                                                      (long)*(short *)((long)g->
                                                  SIN_TAB + (ulong)((uint)(g->TL_TAB[(long)iVar3 +
                                                                                     (long)*(short *
                                                  )((long)g->SIN_TAB +
                                                   (ulong)(uVar19 >> 0xd & 0x1ffe))] + iVar12) >>
                                                  0xd & 0x1ffe))]) >> 0xd & 0x1ffe))) * 4 + 2);
      iVar10 = ((int)*(short *)((long)g->LFO_FREQ_TAB + uVar16) * ch->FMS >> 10) + 0x100;
      iVar2 = ch->SLOT[0].Finc;
      iVar13 = ch->SLOT[2].Finc;
      iVar3 = ch->SLOT[1].Finc;
      iVar4 = ch->SLOT[3].Finc;
      uVar16._0_4_ = ch->LEFT;
      uVar16._4_4_ = ch->RIGHT;
      uVar5 = *(undefined4 *)(buf + lVar6 * 2);
      local_cc = local_cc + local_8c;
      ch->SLOT[0].Ecnt = local_cc;
      if (local_cc < local_90) goto switchD_006c53ca_default;
      switch(local_80) {
      case 0:
        local_90 = ch->SLOT[0].SLL;
        local_8c = ch->SLOT[0].EincD;
        ch->SLOT[0].Einc = local_8c;
        ch->SLOT[0].Ecmp = local_90;
        ch->SLOT[0].Ecurp = 1;
        ch->SLOT[0].Ecnt = 0x10000000;
        local_cc = 0x10000000;
        local_80 = 1;
        break;
      case 1:
        local_cc = ch->SLOT[0].SLL;
        local_8c = ch->SLOT[0].EincS;
        ch->SLOT[0].Ecnt = local_cc;
        ch->SLOT[0].Einc = local_8c;
        ch->SLOT[0].Ecmp = 0x20000000;
        ch->SLOT[0].Ecurp = 2;
        local_90 = 0x20000000;
        local_80 = 2;
        break;
      case 2:
        if ((uVar21 & 8) == 0) goto switchD_006c53ca_caseD_3;
        if ((uVar21 & 1) == 0) {
          local_8c = ch->SLOT[0].EincA;
          ch->SLOT[0].Einc = local_8c;
          ch->SLOT[0].Ecmp = 0x10000000;
          ch->SLOT[0].Ecurp = 0;
          ch->SLOT[0].Ecnt = 0;
          local_80 = 0;
          ch->SLOT[0].env_xor = 0;
          ch->SLOT[0].env_max = 0x7fffffff;
          local_90 = 0x10000000;
          local_ac = 0x7fffffff;
          uVar21 = uVar21 * 2 & 4;
          ch->SLOT[0].SEG = uVar21;
          if (uVar21 == 0) {
            local_bc = 0;
          }
          else {
            ch->SLOT[0].env_xor = 0xfff;
            ch->SLOT[0].env_max = 0xfff;
            local_ac = 0xfff;
            local_bc = 0xfff;
          }
          local_cc = 0;
          break;
        }
        ch->SLOT[0].env_xor = 0;
        ch->SLOT[0].env_max = 0x7fffffff;
        uVar21 = uVar21 * 2 & 4;
        ch->SLOT[0].SEG = uVar21;
        if (uVar21 == 0) {
          local_bc = 0;
          local_ac = 0x7fffffff;
        }
        else {
          ch->SLOT[0].env_xor = 0xfff;
          ch->SLOT[0].env_max = 0xfff;
          local_ac = 0xfff;
          local_bc = 0xfff;
        }
        goto LAB_006c541d;
      case 3:
switchD_006c53ca_caseD_3:
LAB_006c541d:
        ch->SLOT[0].Ecnt = 0x20000000;
        ch->SLOT[0].Einc = 0;
        ch->SLOT[0].Ecmp = 0x20000001;
        local_cc = 0x20000000;
        local_90 = 0x20000001;
        local_8c = 0;
      }
switchD_006c53ca_default:
      local_d0 = local_d0 + local_94;
      ch->SLOT[1].Ecnt = local_d0;
      if (local_d0 < local_a0) goto switchD_006c54d3_default;
      switch(local_e0) {
      case 0:
        local_a0 = ch->SLOT[1].SLL;
        local_94 = ch->SLOT[1].EincD;
        ch->SLOT[1].Einc = local_94;
        ch->SLOT[1].Ecmp = local_a0;
        ch->SLOT[1].Ecurp = 1;
        ch->SLOT[1].Ecnt = 0x10000000;
        local_d0 = 0x10000000;
        local_e0 = 1;
        break;
      case 1:
        local_d0 = ch->SLOT[1].SLL;
        local_94 = ch->SLOT[1].EincS;
        ch->SLOT[1].Ecnt = local_d0;
        ch->SLOT[1].Einc = local_94;
        ch->SLOT[1].Ecmp = 0x20000000;
        ch->SLOT[1].Ecurp = 2;
        local_a0 = 0x20000000;
        local_e0 = 2;
        break;
      case 2:
        if ((uVar7 & 8) == 0) goto switchD_006c54d3_caseD_3;
        if ((uVar7 & 1) == 0) {
          local_94 = ch->SLOT[1].EincA;
          ch->SLOT[1].Einc = local_94;
          ch->SLOT[1].Ecmp = 0x10000000;
          ch->SLOT[1].Ecurp = 0;
          ch->SLOT[1].Ecnt = 0;
          local_e0 = 0;
          ch->SLOT[1].env_xor = 0;
          ch->SLOT[1].env_max = 0x7fffffff;
          local_a0 = 0x10000000;
          local_b4 = 0x7fffffff;
          uVar7 = uVar7 * 2 & 4;
          ch->SLOT[1].SEG = uVar7;
          if (uVar7 == 0) {
            local_c4 = 0;
          }
          else {
            ch->SLOT[1].env_xor = 0xfff;
            ch->SLOT[1].env_max = 0xfff;
            local_b4 = 0xfff;
            local_c4 = 0xfff;
          }
          local_d0 = 0;
          break;
        }
        ch->SLOT[1].env_xor = 0;
        ch->SLOT[1].env_max = 0x7fffffff;
        uVar7 = uVar7 * 2 & 4;
        ch->SLOT[1].SEG = uVar7;
        if (uVar7 == 0) {
          local_c4 = 0;
          local_b4 = 0x7fffffff;
        }
        else {
          ch->SLOT[1].env_xor = 0xfff;
          ch->SLOT[1].env_max = 0xfff;
          local_b4 = 0xfff;
          local_c4 = 0xfff;
        }
        goto LAB_006c5525;
      case 3:
switchD_006c54d3_caseD_3:
LAB_006c5525:
        ch->SLOT[1].Ecnt = 0x20000000;
        ch->SLOT[1].Einc = 0;
        ch->SLOT[1].Ecmp = 0x20000001;
        local_d0 = 0x20000000;
        local_a0 = 0x20000001;
        local_94 = 0;
      }
switchD_006c54d3_default:
      iVar17 = iVar17 + local_98;
      ch->SLOT[2].Ecnt = iVar17;
      if (iVar17 < local_a4) goto switchD_006c55d8_default;
      switch(iVar9) {
      case 0:
        local_a4 = ch->SLOT[2].SLL;
        local_98 = ch->SLOT[2].EincD;
        ch->SLOT[2].Einc = local_98;
        ch->SLOT[2].Ecmp = local_a4;
        ch->SLOT[2].Ecurp = 1;
        ch->SLOT[2].Ecnt = 0x10000000;
        iVar17 = 0x10000000;
        iVar9 = 1;
        break;
      case 1:
        iVar17 = ch->SLOT[2].SLL;
        local_98 = ch->SLOT[2].EincS;
        ch->SLOT[2].Ecnt = iVar17;
        ch->SLOT[2].Einc = local_98;
        ch->SLOT[2].Ecmp = 0x20000000;
        ch->SLOT[2].Ecurp = 2;
        local_a4 = 0x20000000;
        iVar9 = 2;
        break;
      case 2:
        if ((uVar22 & 8) != 0) {
          if ((uVar22 & 1) == 0) {
            local_98 = ch->SLOT[2].EincA;
            ch->SLOT[2].Einc = local_98;
            ch->SLOT[2].Ecmp = 0x10000000;
            ch->SLOT[2].Ecurp = 0;
            ch->SLOT[2].Ecnt = 0;
            ch->SLOT[2].env_xor = 0;
            ch->SLOT[2].env_max = 0x7fffffff;
            local_a4 = 0x10000000;
            local_b0 = 0x7fffffff;
            uVar22 = uVar22 * 2 & 4;
            ch->SLOT[2].SEG = uVar22;
            if (uVar22 == 0) {
              local_c0 = 0;
            }
            else {
              ch->SLOT[2].env_xor = 0xfff;
              ch->SLOT[2].env_max = 0xfff;
              local_b0 = 0xfff;
              local_c0 = 0xfff;
            }
            iVar17 = 0;
            iVar9 = 0;
            break;
          }
          ch->SLOT[2].env_xor = 0;
          ch->SLOT[2].env_max = 0x7fffffff;
          uVar22 = uVar22 * 2 & 4;
          ch->SLOT[2].SEG = uVar22;
          if (uVar22 == 0) {
            local_c0 = 0;
            local_b0 = 0x7fffffff;
          }
          else {
            ch->SLOT[2].env_xor = 0xfff;
            ch->SLOT[2].env_max = 0xfff;
            local_b0 = 0xfff;
            local_c0 = 0xfff;
          }
        }
        goto LAB_006c563d;
      case 3:
LAB_006c563d:
        ch->SLOT[2].Ecnt = 0x20000000;
        ch->SLOT[2].Einc = 0;
        ch->SLOT[2].Ecmp = 0x20000001;
        iVar17 = 0x20000000;
        local_a4 = 0x20000001;
        local_98 = 0;
      }
switchD_006c55d8_default:
      local_d4 = local_d4 + local_9c;
      ch->SLOT[3].Ecnt = local_d4;
      if (local_d4 < local_a8) goto switchD_006c5727_default;
      switch(local_e4) {
      case 0:
        local_a8 = ch->SLOT[3].SLL;
        local_9c = ch->SLOT[3].EincD;
        ch->SLOT[3].Einc = local_9c;
        ch->SLOT[3].Ecmp = local_a8;
        ch->SLOT[3].Ecurp = 1;
        ch->SLOT[3].Ecnt = 0x10000000;
        local_d4 = 0x10000000;
        local_e4 = 1;
        break;
      case 1:
        local_d4 = ch->SLOT[3].SLL;
        local_9c = ch->SLOT[3].EincS;
        ch->SLOT[3].Ecnt = local_d4;
        ch->SLOT[3].Einc = local_9c;
        ch->SLOT[3].Ecmp = 0x20000000;
        ch->SLOT[3].Ecurp = 2;
        local_a8 = 0x20000000;
        local_e4 = 2;
        break;
      case 2:
        if ((local_7c & 8) != 0) {
          if ((local_7c & 1) == 0) {
            local_9c = ch->SLOT[3].EincA;
            ch->SLOT[3].Einc = local_9c;
            ch->SLOT[3].Ecmp = 0x10000000;
            ch->SLOT[3].Ecurp = 0;
            ch->SLOT[3].Ecnt = 0;
            local_e4 = 0;
            ch->SLOT[3].env_xor = 0;
            ch->SLOT[3].env_max = 0x7fffffff;
            local_a8 = 0x10000000;
            local_b8 = 0x7fffffff;
            local_7c = local_7c * 2 & 4;
            ch->SLOT[3].SEG = local_7c;
            if (local_7c == 0) {
              local_c8 = 0;
            }
            else {
              ch->SLOT[3].env_xor = 0xfff;
              ch->SLOT[3].env_max = 0xfff;
              local_b8 = 0xfff;
              local_c8 = 0xfff;
            }
            local_d4 = 0;
            break;
          }
          ch->SLOT[3].env_xor = 0;
          ch->SLOT[3].env_max = 0x7fffffff;
          local_7c = local_7c * 2 & 4;
          ch->SLOT[3].SEG = local_7c;
          if (local_7c == 0) {
            local_c8 = 0;
            local_b8 = 0x7fffffff;
          }
          else {
            ch->SLOT[3].env_xor = 0xfff;
            ch->SLOT[3].env_max = 0xfff;
            local_b8 = 0xfff;
            local_c8 = 0xfff;
          }
        }
        goto LAB_006c5813;
      case 3:
LAB_006c5813:
        ch->SLOT[3].Ecnt = 0x20000000;
        ch->SLOT[3].Einc = 0;
        ch->SLOT[3].Ecmp = 0x20000001;
        local_d4 = 0x20000000;
        local_a8 = 0x20000001;
        local_9c = 0;
      }
switchD_006c5727_default:
      iVar20 = ((uint)(iVar2 * iVar10) >> 8) + iVar20;
      uVar19 = ((uint)(iVar13 * iVar10) >> 8) + uVar19;
      iVar12 = ((uint)(iVar3 * iVar10) >> 8) + iVar12;
      iVar11 = ((uint)(iVar10 * iVar4) >> 8) + iVar11;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar16 & CONCAT44(iVar14,iVar14);
      ch->S0_OUT[0] = iVar8;
      auVar23 = pshuflw(auVar23,auVar23,0xe8);
      *(uint *)(buf + lVar6 * 2) =
           CONCAT22((short)((uint)uVar5 >> 0x10) + auVar23._2_2_,(short)uVar5 + auVar23._0_2_);
      lVar6 = lVar6 + 1;
      iVar2 = local_64;
    } while (length != (int)lVar6);
    ch->S0_OUT[1] = local_64;
    ch->SLOT[0].Fcnt = iVar20;
    ch->SLOT[2].Fcnt = uVar19;
    ch->SLOT[1].Fcnt = iVar12;
    ch->SLOT[3].Fcnt = iVar11;
  }
  return;
}

Assistant:

void ym2612_update_chan<algo>::func( tables_t& g, channel_t& ch,
		Ym2612_Emu::sample_t* buf, int length )
{
	int not_end = ch.SLOT [S3].Ecnt - ENV_END;
	
	// algo is a compile-time constant, so all conditions based on it are resolved
	// during compilation
	
	// special cases
	if ( algo == 7 )
		not_end |= ch.SLOT [S0].Ecnt - ENV_END;
	
	if ( algo >= 5 )
		not_end |= ch.SLOT [S2].Ecnt - ENV_END;
	
	if ( algo >= 4 )
		not_end |= ch.SLOT [S1].Ecnt - ENV_END;
	
	int CH_S0_OUT_1 = ch.S0_OUT [1];
	
	int in0 = ch.SLOT [S0].Fcnt;
	int in1 = ch.SLOT [S1].Fcnt;
	int in2 = ch.SLOT [S2].Fcnt;
	int in3 = ch.SLOT [S3].Fcnt;
	
	int YM2612_LFOinc = g.LFOinc;
	int YM2612_LFOcnt = g.LFOcnt + YM2612_LFOinc;
	
	if ( !not_end )
		return;
	
	do
	{
		// envelope
		int const env_LFO = g.LFO_ENV_TAB [YM2612_LFOcnt >> LFO_LBITS & LFO_MASK];
		
		short const* const ENV_TAB = g.ENV_TAB;
		
	#define CALC_EN( x ) \
		int temp##x = ENV_TAB [ch.SLOT [S##x].Ecnt >> ENV_LBITS] + ch.SLOT [S##x].TLL;  \
		int en##x = ((temp##x ^ ch.SLOT [S##x].env_xor) + (env_LFO >> ch.SLOT [S##x].AMS)) &    \
				((temp##x - ch.SLOT [S##x].env_max) >> 31);
		
		CALC_EN( 0 )
		CALC_EN( 1 )
		CALC_EN( 2 )
		CALC_EN( 3 )
		
		int const* const TL_TAB = g.TL_TAB;
		
	#define SINT( i, o ) (TL_TAB [g.SIN_TAB [(i)] + (o)])
		
		// feedback
		int CH_S0_OUT_0 = ch.S0_OUT [0];
		{
			int temp = in0 + ((CH_S0_OUT_0 + CH_S0_OUT_1) >> ch.FB);
			CH_S0_OUT_1 = CH_S0_OUT_0;
			CH_S0_OUT_0 = SINT( (temp >> SIN_LBITS) & SIN_MASK, en0 );
		}
		
		int CH_OUTd;
		if ( algo == 0 )
		{
			int temp = in1 + CH_S0_OUT_1;
			temp = in2 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en1 );
			temp = in3 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 1 )
		{
			int temp = in2 + CH_S0_OUT_1 + SINT( (in1 >> SIN_LBITS) & SIN_MASK, en1 );
			temp = in3 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 2 )
		{
			int temp = in2 + SINT( (in1 >> SIN_LBITS) & SIN_MASK, en1 );
			temp = in3 + CH_S0_OUT_1 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 3 )
		{
			int temp = in1 + CH_S0_OUT_1;
			temp = in3 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 4 )
		{
			int temp = in3 + SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( ((in1 + CH_S0_OUT_1) >> SIN_LBITS) & SIN_MASK, en1 );
			//DO_LIMIT
		}
		else if ( algo == 5 )
		{
			int temp = CH_S0_OUT_1;
			CH_OUTd = SINT( ((in3 + temp) >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( ((in1 + temp) >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( ((in2 + temp) >> SIN_LBITS) & SIN_MASK, en2 );
			//DO_LIMIT
		}
		else if ( algo == 6 )
		{
			CH_OUTd = SINT( (in3 >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( ((in1 + CH_S0_OUT_1) >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 );
			//DO_LIMIT
		}
		else if ( algo == 7 )
		{
			CH_OUTd = SINT( (in3 >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( (in1 >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 ) + CH_S0_OUT_1;
			//DO_LIMIT
		}
		
		CH_OUTd >>= MAX_OUT_BITS - output_bits + 2;
		
		// update phase
		unsigned freq_LFO = ((g.LFO_FREQ_TAB [YM2612_LFOcnt >> LFO_LBITS & LFO_MASK] *
				ch.FMS) >> (LFO_HBITS - 1 + 1)) + (1L << (LFO_FMS_LBITS - 1));
		YM2612_LFOcnt += YM2612_LFOinc;
		in0 += (ch.SLOT [S0].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		in1 += (ch.SLOT [S1].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		in2 += (ch.SLOT [S2].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		in3 += (ch.SLOT [S3].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		
		int t0 = buf [0] + (CH_OUTd & ch.LEFT);
		int t1 = buf [1] + (CH_OUTd & ch.RIGHT);
		
		update_envelope( ch.SLOT [0] );
		update_envelope( ch.SLOT [1] );
		update_envelope( ch.SLOT [2] );
		update_envelope( ch.SLOT [3] );
		
		ch.S0_OUT [0] = CH_S0_OUT_0;
		buf [0] = t0;
		buf [1] = t1;
		buf += 2;
	}
	while ( --length );
	
	ch.S0_OUT [1] = CH_S0_OUT_1;
	
	ch.SLOT [S0].Fcnt = in0;
	ch.SLOT [S1].Fcnt = in1;
	ch.SLOT [S2].Fcnt = in2;
	ch.SLOT [S3].Fcnt = in3;
}